

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxKeyboard.cpp
# Opt level: O1

void __thiscall OIS::LinuxKeyboard::_handleKeyPress(LinuxKeyboard *this,XEvent *event)

{
  TextTranslationMode TVar1;
  ulong uVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  uint text;
  value_type *__val;
  _Hash_node_base *p_Var6;
  pointer pcVar7;
  ulong uVar8;
  KeyCode kc;
  __node_base_ptr p_Var9;
  __node_base_ptr p_Var10;
  bool bVar11;
  int status;
  KeySym keySym;
  int local_44;
  _Hash_node_base *local_40;
  int local_34;
  
  if ((_handleKeyPress(_XEvent&)::buf == '\0') &&
     (iVar4 = __cxa_guard_acquire(&_handleKeyPress(_XEvent&)::buf), iVar4 != 0)) {
    _handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    _handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    _handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar7 = (pointer)operator_new(0x20);
    _handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar7 + 0x20;
    _handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start = pcVar7;
    _handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         _handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    pcVar7[0x10] = '\0';
    pcVar7[0x11] = '\0';
    pcVar7[0x12] = '\0';
    pcVar7[0x13] = '\0';
    pcVar7[0x14] = '\0';
    pcVar7[0x15] = '\0';
    pcVar7[0x16] = '\0';
    pcVar7[0x17] = '\0';
    pcVar7[0x18] = '\0';
    pcVar7[0x19] = '\0';
    pcVar7[0x1a] = '\0';
    pcVar7[0x1b] = '\0';
    pcVar7[0x1c] = '\0';
    pcVar7[0x1d] = '\0';
    pcVar7[0x1e] = '\0';
    pcVar7[0x1f] = '\0';
    pcVar7[0] = '\0';
    pcVar7[1] = '\0';
    pcVar7[2] = '\0';
    pcVar7[3] = '\0';
    pcVar7[4] = '\0';
    pcVar7[5] = '\0';
    pcVar7[6] = '\0';
    pcVar7[7] = '\0';
    pcVar7[8] = '\0';
    pcVar7[9] = '\0';
    pcVar7[10] = '\0';
    pcVar7[0xb] = '\0';
    pcVar7[0xc] = '\0';
    pcVar7[0xd] = '\0';
    pcVar7[0xe] = '\0';
    pcVar7[0xf] = '\0';
    __cxa_atexit(std::vector<char,_std::allocator<char>_>::~vector,&_handleKeyPress::buf,
                 &__dso_handle);
    __cxa_guard_release(&_handleKeyPress(_XEvent&)::buf);
  }
  iVar4 = XFilterEvent(event,0);
  if (this->xic == (XIC)0x0) {
    iVar5 = XLookupString(event,_handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                          ~(uint)_handleKeyPress::buf.
                                 super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start +
                          (int)_handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>.
                               _M_impl.super__Vector_impl_data._M_finish,&local_40,0);
    _handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start[iVar5] = '\0';
  }
  else {
    local_34 = iVar4;
    do {
      iVar5 = Xutf8LookupString(this->xic,event,
                                _handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                ~(uint)_handleKeyPress::buf.
                                       super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                       super__Vector_impl_data._M_start +
                                (int)_handleKeyPress::buf.
                                     super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                     super__Vector_impl_data._M_finish,&local_40,&local_44);
      _handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start[iVar5] = '\0';
      if (local_44 == -1) {
        std::vector<char,_std::allocator<char>_>::resize
                  (&_handleKeyPress::buf,
                   ((long)_handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)_handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>.
                         _M_impl.super__Vector_impl_data._M_start) * 2);
      }
      iVar4 = local_34;
    } while (local_44 == -1);
  }
  text = 0;
  if ((iVar4 == 0) && (text = 0, 0 < iVar5)) {
    TVar1 = (this->super_Keyboard).mTextMode;
    if (TVar1 == Ascii) {
      text = (uint)*_handleKeyPress::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
    }
    else if (TVar1 == Unicode) {
      text = UTF8ToUTF32((uchar *)_handleKeyPress::buf.
                                  super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start);
    }
  }
  (this->super_Keyboard).mModifiers =
       (uint)((this->numLockMask & (event->xkey).state) != 0) << 0x10 |
       (uint)((this->capsLockMask & (event->xkey).state) != 0) << 0xc |
       (this->super_Keyboard).mModifiers & 0xfffeefff;
  if (local_40 != (_Hash_node_base *)0x0) {
    uVar2 = (this->keyConversionToOIS)._M_h._M_bucket_count;
    uVar8 = (ulong)local_40 % uVar2;
    p_Var9 = (this->keyConversionToOIS)._M_h._M_buckets[uVar8];
    p_Var10 = (__node_base_ptr)0x0;
    if ((p_Var9 != (__node_base_ptr)0x0) &&
       (p_Var6 = p_Var9->_M_nxt, p_Var10 = p_Var9, p_Var9->_M_nxt[1]._M_nxt != local_40)) {
      while (p_Var9 = p_Var6, p_Var6 = p_Var9->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
        p_Var10 = (__node_base_ptr)0x0;
        if (((ulong)p_Var6[1]._M_nxt % uVar2 != uVar8) ||
           (p_Var10 = p_Var9, p_Var6[1]._M_nxt == local_40)) goto LAB_0011a250;
      }
      p_Var10 = (__node_base_ptr)0x0;
    }
LAB_0011a250:
    if (p_Var10 == (__node_base_ptr)0x0) {
      p_Var6 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var6 = p_Var10->_M_nxt;
    }
    if (p_Var6 == (_Hash_node_base *)0x0) {
      bVar3 = XKeysymToKeycode(this->display);
      bVar11 = bVar3 < 9;
      kc = bVar3 - KC_7;
    }
    else {
      kc = *(KeyCode *)&p_Var6[2]._M_nxt;
      bVar11 = false;
    }
    if (!bVar11) goto LAB_0011a285;
  }
  kc = KC_UNASSIGNED;
LAB_0011a285:
  _injectKeyDown(this,kc,text);
  if ((((event->xkey).state & 8) != 0) && (local_40 == (_Hash_node_base *)0xff09)) {
    *(undefined1 *)
     ((long)&(this->super_Keyboard).super_Object.mCreator[1].mFactories.
             super__Vector_base<OIS::FactoryCreator_*,_std::allocator<OIS::FactoryCreator_*>_>.
             _M_impl.super__Vector_impl_data._M_finish + 2) = 0;
  }
  return;
}

Assistant:

void LinuxKeyboard::_handleKeyPress(XEvent& event)
{
	XKeyEvent& e = (XKeyEvent&)event;
	static std::vector<char> buf(32);
	KeySym keySym;
	unsigned int character = 0;
	int bytes			   = 0;
	bool haveChar		   = true;

	haveChar = !XFilterEvent(&event, None);

	if(xic)
	{
		Status status;
		do
		{
			bytes	   = Xutf8LookupString(xic, &e, &buf[0], buf.size() - 1, &keySym, &status);
			buf[bytes] = '\0';

			if(status == XBufferOverflow)
				buf.resize(buf.size() * 2);
		} while(status == XBufferOverflow);
	}
	else
	{
		bytes	   = XLookupString(&e, &buf[0], buf.size() - 1, &keySym, NULL);
		buf[bytes] = '\0';
	}

	if(haveChar && bytes > 0)
	{
		if(mTextMode == Unicode)
			character = UTF8ToUTF32(reinterpret_cast<unsigned char*>(&buf[0]));
		else if(mTextMode == Ascii)
			character = buf[0];
	}

	if(e.state & capsLockMask)
		mModifiers |= CapsLock;
	else
		mModifiers &= ~CapsLock;

	if(e.state & numLockMask)
		mModifiers |= NumLock;
	else
		mModifiers &= ~NumLock;

	KeyCode kc = KeySymToOISKeyCode(keySym);
	_injectKeyDown(kc, character);

	//Check for Alt-Tab
	LinuxInputManager* linMan = static_cast<LinuxInputManager*>(mCreator);
	if((e.state & Mod1Mask) && (keySym == XK_Tab))
		linMan->_setGrabState(false);
}